

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O0

string * zmq_recv_abi_cxx11_(string *__return_storage_ptr__,socket_t *socket)

{
  char *pcVar1;
  size_t sVar2;
  size_t in_RCX;
  int in_R8D;
  allocator local_65 [13];
  undefined1 local_58 [8];
  message_t msg;
  socket_t *socket_local;
  
  msg.msg._._56_8_ = socket;
  zmq::message_t::message_t((message_t *)local_58);
  zmq::detail::socket_base::recv
            ((socket_base *)msg.msg._._56_8_,(int)(message_t *)local_58,(void *)0x0,in_RCX,in_R8D);
  pcVar1 = (char *)zmq::message_t::data((message_t *)local_58);
  sVar2 = zmq::message_t::size((message_t *)local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,sVar2,local_65);
  std::allocator<char>::~allocator((allocator<char> *)local_65);
  zmq::message_t::~message_t((message_t *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string zmq_recv(zmq::socket_t &socket) {
    zmq::message_t msg;
    socket.recv(&msg);

    return std::string(static_cast<char*>(msg.data()), msg.size());
}